

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ON_XMLVariant * __thiscall
ON_InternalXMLImpl::InternalGetParameter
          (ON_XMLVariant *__return_storage_ptr__,ON_InternalXMLImpl *this,wchar_t *path_to_node,
          wchar_t *param_name,wchar_t *default_type,ON_XMLVariant *def)

{
  bool bVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  undefined4 extraout_var;
  ON_XMLParameters p;
  ON_XMLVariant value;
  ON_XMLParameters local_140;
  wchar_t *local_130;
  ON_XMLVariant local_128;
  
  local_130 = param_name;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar2 == 0) {
    pOVar3 = Node(this);
    iVar2 = (*pOVar3->_vptr_ON_XMLNode[0x29])(pOVar3,path_to_node);
    if ((ON_XMLNode *)CONCAT44(extraout_var,iVar2) == (ON_XMLNode *)0x0) {
      ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__,def);
    }
    else {
      ::ON_XMLVariant::ON_XMLVariant(&local_128);
      ON_XMLParameters::ON_XMLParameters(&local_140,(ON_XMLNode *)CONCAT44(extraout_var,iVar2));
      ON_XMLParameters::SetDefaultReadType(&local_140,default_type);
      bVar1 = ON_XMLParameters::GetParam(&local_140,local_130,&local_128);
      if (bVar1) {
        def = &local_128;
      }
      ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__,def);
      ON_XMLParameters::~ON_XMLParameters(&local_140);
      ::ON_XMLVariant::~ON_XMLVariant(&local_128);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ON_XMLVariant ON_InternalXMLImpl::InternalGetParameter(const wchar_t* path_to_node, const wchar_t* param_name, const wchar_t* default_type, const ON_XMLVariant& def) const
{
  std::lock_guard<std::recursive_mutex> lg(_mutex);

  const ON_XMLNode* node_read = Node().GetNodeAtPath(path_to_node);
  if (nullptr == node_read)
    return def;

  ON_XMLVariant value;
  ON_XMLParameters p(*node_read);
  p.SetDefaultReadType(default_type);
  if (!p.GetParam(param_name, value))
    return def;

  return value;
}